

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

size_t __thiscall Apt::GetSimilarTaxiNode(Apt *this,double _lat,double _lon,size_t dontCombineWith)

{
  bool bVar1;
  pointer pTVar2;
  long in_RSI;
  double in_RDI;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_> *p_Var3;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_> *in_XMM0_Qa
  ;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  TaxiNode *in_XMM1_Qa;
  double dist2;
  const_iterator iter;
  const_iterator bestIter;
  const_iterator dontIter;
  double bestDist2;
  double lonDiff;
  double latDiff;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
  in_stack_ffffffffffffff58;
  size_t sVar5;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
  in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_> local_58;
  TaxiNode *local_50;
  TaxiNode *local_48;
  TaxiNode *local_40;
  double local_38;
  double local_30;
  undefined8 local_28;
  long local_20;
  TaxiNode *local_18;
  __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_> *local_10;
  
  local_28 = 0x3ef2dee381a29e79;
  local_20 = in_RSI;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  local_30 = Dist2Lon((double)in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58._M_current
                     );
  local_38 = INFINITY;
  if (local_20 == -1) {
    local_40 = (TaxiNode *)
               std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cend
                         (in_stack_ffffffffffffff58._M_current);
  }
  else {
    local_48 = (TaxiNode *)
               std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cbegin
                         (in_stack_ffffffffffffff58._M_current);
    local_40 = (TaxiNode *)
               std::
               next<__gnu_cxx::__normal_iterator<TaxiNode_const*,std::vector<TaxiNode,std::allocator<TaxiNode>>>>
                         (in_stack_ffffffffffffff58,0x1ac88c);
  }
  local_50 = (TaxiNode *)
             std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cend
                       (in_stack_ffffffffffffff58._M_current);
  local_58._M_current =
       (TaxiNode *)
       std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cbegin
                 (in_stack_ffffffffffffff58._M_current);
  while( true ) {
    std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cend
              ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_ffffffffffffff58._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                        *)in_stack_ffffffffffffff58._M_current);
    if (!bVar1) break;
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                        *)in_stack_ffffffffffffff58._M_current);
    if (bVar1) {
      p_Var3 = &local_58;
      __gnu_cxx::
      __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
      operator->(p_Var3);
      std::abs((int)p_Var3);
      if (extraout_XMM0_Qa < 1.7996462795237596e-05) {
        p_Var3 = &local_58;
        __gnu_cxx::
        __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
        operator->(p_Var3);
        std::abs((int)p_Var3);
        if (extraout_XMM0_Qa_00 < local_30) {
          in_stack_ffffffffffffff60 = local_10;
          in_stack_ffffffffffffff68._M_current = local_18;
          pTVar2 = __gnu_cxx::
                   __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                   ::operator->(&local_58);
          in_stack_ffffffffffffff70._M_current = (TaxiNode *)pTVar2->lat;
          __gnu_cxx::
          __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
          operator->(&local_58);
          dVar4 = DistLatLonSqr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80,in_RDI);
          if (dVar4 < local_38) {
            local_50 = local_58._M_current;
            local_38 = dVar4;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
    operator++(&local_58);
  }
  std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cend
            ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_ffffffffffffff58._M_current);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff60,
                     (__normal_iterator<const_TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                      *)in_stack_ffffffffffffff58._M_current);
  if (bVar1) {
    std::vector<TaxiNode,_std::allocator<TaxiNode>_>::cbegin
              ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_ffffffffffffff58._M_current);
    sVar5 = std::
            distance<__gnu_cxx::__normal_iterator<TaxiNode_const*,std::vector<TaxiNode,std::allocator<TaxiNode>>>>
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    sVar5 = 0xffffffffffffffff;
  }
  return sVar5;
}

Assistant:

size_t GetSimilarTaxiNode (double _lat, double _lon,
                               size_t dontCombineWith = ULONG_MAX) const
    {
        constexpr double latDiff = Dist2Lat(APT_MAX_SIMILAR_NODE_DIST_M);
        const     double lonDiff = Dist2Lon(APT_MAX_SIMILAR_NODE_DIST_M, _lat);
        
        double bestDist2 = HUGE_VAL;
        const vecTaxiNodesTy::const_iterator dontIter =
        dontCombineWith == ULONG_MAX ? vecTaxiNodes.cend() :
                                       std::next(vecTaxiNodes.cbegin(),(long)dontCombineWith);
        vecTaxiNodesTy::const_iterator bestIter = vecTaxiNodes.cend();
        for (auto iter = vecTaxiNodes.cbegin(); iter != vecTaxiNodes.cend(); ++iter)
        {
            // quick check: reasonable lat/lon range
            if (iter != dontIter &&         // not the one node to skip
                std::abs(iter->lat - _lat) < latDiff &&
                std::abs(iter->lon - _lon) < lonDiff)
            {
                // find shortest distance
                const double dist2 = DistLatLonSqr(_lat, _lon, iter->lat, iter->lon);
                if (dist2 < bestDist2) {
                    bestDist2 = dist2;
                    bestIter = iter;
                }
            }
        }
        
        // Found something?
        return (bestIter != vecTaxiNodes.cend() ?
                (size_t)std::distance(vecTaxiNodes.cbegin(), bestIter) :
                ULONG_MAX);
    }